

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O0

void wasm::OptUtils::replaceFunctions
               (PassRunner *runner,Module *module,
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *replacements)

{
  bool bVar1;
  reference this;
  pointer pEVar2;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  MaybeReplace local_170;
  undefined1 local_150 [8];
  FunctionRefReplacer replacer;
  anon_class_8_1_3cc6d29f maybeReplace;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *replacements_local;
  Module *module_local;
  PassRunner *runner_local;
  
  replacer.maybeReplace._M_invoker = (_Invoker_type)replacements;
  std::function<void(wasm::Name&)>::
  function<wasm::OptUtils::replaceFunctions(wasm::PassRunner*,wasm::Module&,std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>const&)::_lambda(wasm::Name&)_1_&,void>
            ((function<void(wasm::Name&)> *)&local_170,
             (anon_class_8_1_3cc6d29f *)&replacer.maybeReplace._M_invoker);
  FunctionRefReplacer::FunctionRefReplacer((FunctionRefReplacer *)local_150,&local_170);
  std::function<void_(wasm::Name_&)>::~function(&local_170);
  WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ::run((WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
         *)local_150,runner,module);
  WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ::runOnModuleCode((WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
                     *)local_150,runner,module);
  bVar1 = IString::is(&(module->start).super_IString);
  if (bVar1) {
    replaceFunctions::anon_class_8_1_3cc6d29f::operator()
              ((anon_class_8_1_3cc6d29f *)&replacer.maybeReplace._M_invoker,&module->start);
  }
  __end2 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin(&module->exports);
  exp = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
        std::
        vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ::end(&module->exports);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                     *)&exp), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
           ::operator*(&__end2);
    pEVar2 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(this);
    if (pEVar2->kind == Function) {
      pEVar2 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(this);
      replaceFunctions::anon_class_8_1_3cc6d29f::operator()
                ((anon_class_8_1_3cc6d29f *)&replacer.maybeReplace._M_invoker,&pEVar2->value);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end2);
  }
  FunctionRefReplacer::~FunctionRefReplacer((FunctionRefReplacer *)local_150);
  return;
}

Assistant:

inline void replaceFunctions(PassRunner* runner,
                             Module& module,
                             const std::map<Name, Name>& replacements) {
  auto maybeReplace = [&](Name& name) {
    auto iter = replacements.find(name);
    if (iter != replacements.end()) {
      name = iter->second;
    }
  };
  // replace direct calls in code both functions and module elements
  FunctionRefReplacer replacer(maybeReplace);
  replacer.run(runner, &module);
  replacer.runOnModuleCode(runner, &module);

  // replace in start
  if (module.start.is()) {
    maybeReplace(module.start);
  }
  // replace in exports
  for (auto& exp : module.exports) {
    if (exp->kind == ExternalKind::Function) {
      maybeReplace(exp->value);
    }
  }
}